

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffghsp(fitsfile *fptr,int *nexist,int *nmore,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  
  if (0 < *status) {
    return *status;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
  }
  if (nexist != (int *)0x0) {
    *nexist = (int)((pFVar2->headend - pFVar2->headstart[pFVar2->curhdu]) / 0x50);
  }
  if (pFVar2->datastart == -1) {
    if (nmore == (int *)0x0) goto LAB_00168b94;
    iVar1 = -1;
  }
  else {
    if (nmore == (int *)0x0) goto LAB_00168b94;
    iVar1 = (int)((pFVar2->datastart - pFVar2->headend) / 0x50) + -1;
  }
  *nmore = iVar1;
LAB_00168b94:
  return *status;
}

Assistant:

int ffghsp(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *nexist,     /* O - number of existing keywords in header */
           int *nmore,      /* O - how many more keywords will fit       */
           int *status)     /* IO - error status                         */
/*
  returns the number of existing keywords (not counting the END keyword)
  and the number of more keyword that will fit in the current header 
  without having to insert more FITS blocks.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
        *nexist = (int) (( ((fptr->Fptr)->headend) - 
                ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      if (nmore)
        *nmore = -1;   /* data not written yet, so room for any keywords */
    }
    else
    {
      /* calculate space available between the data and the END card */
      if (nmore)
        *nmore = (int) (((fptr->Fptr)->datastart - (fptr->Fptr)->headend) / 80 - 1);
    }

    return(*status);
}